

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpserver.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint __i;
  uint uVar4;
  int iVar5;
  int iVar6;
  __pid_t _Var7;
  uint __fd;
  uint uVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  ssize_t sVar14;
  long lVar15;
  sigset_t *psVar16;
  ulong uVar17;
  __sigset_t *p_Var18;
  ulong uVar19;
  byte bVar20;
  ulong local_77a0;
  ulong local_7798;
  ulong local_7790;
  socklen_t sin_size;
  sockaddr_can caddr;
  sockaddr_in clientaddr;
  sockaddr_in saddr;
  fd_set readfds;
  sigaction signalaction;
  sigset_t sigset;
  uchar msg [6001];
  char rxmsg [12004];
  char txmsg [12003];
  
  bVar20 = 0;
  sin_size = 0x10;
  caddr.can_addr.j1939.name = 0xffffffffffffffff;
  local_77a0 = 0xffffffffffffffff;
  local_7798 = 0xffffffffffffffff;
  local_7790 = 0;
  bVar3 = false;
switchD_001015ff_caseD_76:
  bVar2 = bVar3;
  uVar4 = getopt(argc,argv,"l:s:d:x:p:P:b:m:w:t:L:v?");
  bVar3 = true;
  switch(uVar4) {
  case 0x62:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.bs = (__u8)uVar11;
    bVar3 = bVar2;
    goto switchD_001015ff_caseD_76;
  case 99:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_001015ff_caseD_63;
  case 100:
    local_77a0 = strtoul(_optarg,(char **)0x0,0x10);
    uVar4 = (uint)local_77a0;
    caddr.can_addr.tp.rx_id = uVar4;
    sVar13 = strlen(_optarg);
    bVar3 = bVar2;
    if (7 < sVar13) {
      local_77a0 = (ulong)(uVar4 | 0x80000000);
      caddr.can_addr.j1939.name = CONCAT44(caddr.can_addr.tp.tx_id,uVar4) | 0x80000000;
    }
    goto switchD_001015ff_caseD_76;
  case 0x6c:
    local_7790 = strtoul(_optarg,(char **)0x0,10);
    bVar3 = bVar2;
    goto switchD_001015ff_caseD_76;
  case 0x6d:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.stmin = (__u8)uVar11;
    bVar3 = bVar2;
    goto switchD_001015ff_caseD_76;
  case 0x70:
    iVar5 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x104125,0x104126);
    if (iVar5 == 2) {
      main::opts.flags = main::opts.flags | 0xc;
      bVar3 = bVar2;
    }
    else if (iVar5 == 1) {
      main::opts.flags = main::opts.flags | 4;
      bVar3 = bVar2;
    }
    else {
      iVar5 = __isoc99_sscanf(_optarg,":%hhx",0x104126);
      if (iVar5 != 1) {
        pcVar9 = "incorrect padding values \'%s\'.\n";
        goto LAB_00101962;
      }
      main::opts.flags = main::opts.flags | 8;
      bVar3 = bVar2;
    }
    goto switchD_001015ff_caseD_76;
  case 0x73:
    local_7798 = strtoul(_optarg,(char **)0x0,0x10);
    uVar4 = (uint)local_7798;
    caddr.can_addr.tp.tx_id = uVar4;
    sVar13 = strlen(_optarg);
    bVar3 = bVar2;
    if (7 < sVar13) {
      local_7798 = (ulong)(uVar4 | 0x80000000);
      caddr.can_addr.j1939.name = CONCAT44(uVar4,caddr.can_addr.tp.rx_id) | 0x8000000000000000;
    }
    goto switchD_001015ff_caseD_76;
  case 0x74:
    uVar11 = strtoul(_optarg,(char **)0x0,10);
    main::opts.frame_txtime = (__u32)uVar11;
    bVar3 = bVar2;
  case 0x76:
    goto switchD_001015ff_caseD_76;
  case 0x77:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.wftmax = (__u8)uVar11;
    bVar3 = bVar2;
    goto switchD_001015ff_caseD_76;
  case 0x78:
    iVar5 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x104124,0x104127);
    uVar4 = 2;
    if (iVar5 != 1) {
      if (iVar5 != 2) {
        pcVar9 = "incorrect extended addr values \'%s\'.\n";
        goto LAB_00101962;
      }
      uVar4 = 0x202;
    }
    main::opts.flags = main::opts.flags | uVar4;
    bVar3 = bVar2;
    goto switchD_001015ff_caseD_76;
  }
  if (uVar4 == 0x4c) goto LAB_001017d2;
  if (uVar4 == 0x50) {
    cVar1 = *_optarg;
    if (cVar1 == 'a') {
      main::opts.flags = main::opts.flags | 0x30;
      bVar3 = bVar2;
    }
    else if (cVar1 == 'c') {
      main::opts.flags = main::opts.flags | 0x20;
      bVar3 = bVar2;
    }
    else {
      if (cVar1 != 'l') {
        printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)cVar1);
        goto LAB_00101969;
      }
      main::opts.flags = main::opts.flags | 0x10;
      bVar3 = bVar2;
    }
    goto switchD_001015ff_caseD_76;
  }
  if (uVar4 != 0xffffffff) {
    if (uVar4 == 0x3f) goto LAB_00101969;
    goto switchD_001015ff_caseD_63;
  }
  if ((((argc - _optind != 1) || ((int)local_7790 == 0)) || ((int)local_7798 == -1)) ||
     ((int)local_77a0 == -1)) goto LAB_0010188e;
  sigemptyset((sigset_t *)&sigset);
  signalaction.__sigaction_handler.sa_handler = childdied;
  psVar16 = (sigset_t *)&sigset;
  p_Var18 = &signalaction.sa_mask;
  for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
    p_Var18->__val[0] = psVar16->__val[0];
    psVar16 = (sigset_t *)((long)psVar16 + ((ulong)bVar20 * -2 + 1) * 8);
    p_Var18 = (__sigset_t *)((long)p_Var18 + (ulong)bVar20 * -0x10 + 8);
  }
  signalaction.sa_flags = 0;
  sigaction(0x11,(sigaction *)&signalaction,(sigaction *)0x0);
  iVar5 = socket(2,1,0);
  if (iVar5 < 0) {
    pcVar9 = "inetsocket";
  }
  else {
    saddr.sin_family = 2;
    saddr.sin_addr.s_addr = 0;
    saddr.sin_port = (ushort)local_7790 << 8 | (ushort)local_7790 >> 8;
    while (iVar6 = bind(iVar5,(sockaddr *)&saddr,0x10), iVar6 < 0) {
      rxmsg[0] = '\0';
      rxmsg[1] = '\0';
      rxmsg[2] = '\0';
      rxmsg[3] = '\0';
      rxmsg[4] = '\0';
      rxmsg[5] = '\0';
      rxmsg[6] = '\0';
      rxmsg[7] = '\0';
      rxmsg[8] = '\0';
      rxmsg[9] = -0x1f;
      rxmsg[10] = -0xb;
      rxmsg[0xb] = '\x05';
      rxmsg[0xc] = '\0';
      rxmsg[0xd] = '\0';
      rxmsg[0xe] = '\0';
      rxmsg[0xf] = '\0';
      putchar(0x2e);
      fflush((FILE *)0x0);
      nanosleep((timespec *)rxmsg,(timespec *)0x0);
    }
    iVar6 = listen(iVar5,3);
    if (iVar6 == 0) {
      do {
        while (uVar4 = accept(iVar5,(sockaddr *)&clientaddr,&sin_size), 0 < (int)uVar4) {
          _Var7 = fork();
          if (_Var7 == 0) {
            __fd = socket(0x1d,2,6);
            if ((int)__fd < 0) {
              pcVar9 = "socket";
            }
            else {
              setsockopt(__fd,0x6a,1,&main::opts,0xc);
              setsockopt(__fd,0x6a,2,&main::fcopts,3);
              if ((main::llopts.tx_dl == '\0') ||
                 (iVar5 = setsockopt(__fd,0x6a,5,&main::llopts,3), -1 < iVar5)) {
                caddr.can_family = 0x1d;
                caddr.can_ifindex = if_nametoindex(argv[_optind]);
                if (caddr.can_ifindex == 0) {
                  pcVar9 = "if_nametoindex";
                }
                else {
                  iVar5 = bind(__fd,(sockaddr *)&caddr,0x18);
                  if (iVar5 < 0) {
                    pcVar9 = "bind";
                  }
                  else {
                    uVar11 = 1L << ((byte)__fd & 0x3f);
                    uVar17 = 1L << ((byte)uVar4 & 0x3f);
                    uVar8 = uVar4;
                    if (uVar4 < __fd) {
                      uVar8 = __fd;
                    }
                    uVar12 = 0;
                    while( true ) {
                      iVar5 = (int)uVar12;
                      do {
                        for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
                          readfds.fds_bits[lVar15] = 0;
                        }
                        readfds.fds_bits[__fd >> 6] = readfds.fds_bits[__fd >> 6] | uVar11;
                        readfds.fds_bits[uVar4 >> 6] = readfds.fds_bits[uVar4 >> 6] | uVar17;
                        select(uVar8 + 1,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,
                               (timeval *)0x0);
                        if ((readfds.fds_bits[__fd >> 6] & uVar11) != 0) {
                          uVar12 = read(__fd,msg,0x1771);
                          if ((int)uVar12 - 0x1771U < 0xffffe890) {
                            pcVar9 = "read from isotp socket";
                            goto LAB_00101dcd;
                          }
                          rxmsg[0] = '<';
                          pcVar9 = (char *)((ulong)rxmsg | 1);
                          for (uVar19 = 0; (uVar12 & 0xffffffff) != uVar19; uVar19 = uVar19 + 1) {
                            sprintf(pcVar9,"%02X",(ulong)msg[uVar19]);
                            pcVar9 = pcVar9 + 2;
                          }
                          sVar13 = strlen(rxmsg);
                          (rxmsg + sVar13)[0] = '>';
                          (rxmsg + sVar13)[1] = '\n';
                          rxmsg[sVar13 + 2] = '\0';
                          if (bVar2) {
                            printf("CAN>TCP %s",rxmsg);
                          }
                          sVar13 = strlen(rxmsg);
                          send(uVar4,rxmsg,sVar13,0);
                        }
                      } while ((readfds.fds_bits[uVar4 >> 6] & uVar17) == 0);
                      lVar15 = (long)iVar5;
                      sVar14 = read(uVar4,txmsg + lVar15,1);
                      if (sVar14 < 1) break;
                      if (iVar5 == 0) {
                        uVar12 = (ulong)(txmsg[0] == '<');
                      }
                      else {
                        uVar12 = 0;
                        if (iVar5 < 0x2ee2) {
                          uVar12 = lVar15 + 1U & 0xffffffff;
                          if (txmsg[lVar15] == '>') {
                            txmsg[lVar15 + 1] = '\0';
                            sVar13 = strlen(txmsg);
                            uVar12 = 0;
                            if ((sVar13 & 1) == 0 && 3 < sVar13) {
                              if (bVar2) {
                                printf("TCP>CAN %s\n",txmsg);
                              }
                              sVar13 = strlen(txmsg);
                              iVar6 = (int)(sVar13 + 0x1fffffffe >> 1);
                              iVar5 = b64hex((char *)((ulong)txmsg | 1),msg,iVar6);
                              uVar12 = 0;
                              if (iVar5 == 0) {
                                send(__fd,msg,(long)iVar6,0);
                                uVar12 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                    pcVar9 = "read from tcp/ip socket";
                  }
                }
              }
              else {
                pcVar9 = "link layer sockopt";
              }
            }
            goto LAB_00101dcd;
          }
          close(uVar4);
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      pcVar9 = "accept";
    }
    else {
      pcVar9 = "listen";
    }
  }
LAB_00101dcd:
  perror(pcVar9);
  goto LAB_00101dd2;
LAB_001017d2:
  iVar5 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x10412c,0x10412d);
  bVar3 = bVar2;
  if (iVar5 != 3) {
    pcVar9 = "unknown link layer options \'%s\'.\n";
LAB_00101962:
    printf(pcVar9,_optarg);
LAB_00101969:
    pcVar9 = __xpg_basename(*argv);
    print_usage(pcVar9);
    exit(0);
  }
  goto switchD_001015ff_caseD_76;
switchD_001015ff_caseD_63:
  fprintf(_stderr,"Unknown option %c\n",(ulong)uVar4);
LAB_0010188e:
  pcVar9 = __xpg_basename(*argv);
  print_usage(pcVar9);
LAB_00101dd2:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	extern int optind, opterr, optopt;
	int opt;

	int sl, sa, sc; /* (L)isten, (A)ccept, (C)AN sockets */ 
	struct sockaddr_in  saddr, clientaddr;
	struct sockaddr_can caddr;
	static struct can_isotp_options opts;
	static struct can_isotp_fc_options fcopts;
	static struct can_isotp_ll_options llopts;
	socklen_t sin_size = sizeof(clientaddr);
	socklen_t caddrlen = sizeof(caddr);

	struct sigaction signalaction;
	sigset_t sigset;

	fd_set readfds;

	int i;
	int nbytes;

	int local_port = 0;
	int verbose = 0;

	int idx = 0; /* index in txmsg[] */

	unsigned char msg[MAX_PDU_LENGTH + 1];   /* isotp socket message buffer (4095 + test_for_too_long_byte)*/
	char rxmsg[MAX_PDU_LENGTH * 2 + 4]; /* isotp->tcp ASCII message buffer (4095*2 + < > \n null) */
	char txmsg[MAX_PDU_LENGTH * 2 + 3]; /* tcp->isotp ASCII message buffer (4095*2 + < > null) */

	/* mark missing mandatory commandline options as missing */
	caddr.can_addr.tp.tx_id = caddr.can_addr.tp.rx_id = NO_CAN_ID;

	while ((opt = getopt(argc, argv, "l:s:d:x:p:P:b:m:w:t:L:v?")) != -1) {
		switch (opt) {
		case 'l':
			local_port = strtoul(optarg, NULL, 10);
			break;

		case 's':
			caddr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
			break;

		case 'd':
			caddr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
			break;

		case 'x':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.ext_address,
					      &opts.rx_ext_address);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_EXTEND_ADDR;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
			else {
				printf("incorrect extended addr values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'p':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.txpad_content,
					      &opts.rxpad_content);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_TX_PADDING;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
			else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
				opts.flags |= CAN_ISOTP_RX_PADDING;
			else {
				printf("incorrect padding values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'P':
			if (optarg[0] == 'l')
				opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
			else if (optarg[0] == 'c')
				opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
			else if (optarg[0] == 'a')
				opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
			else {
				printf("unknown padding check option '%c'.\n", optarg[0]);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'b':
			fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'm':
			fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'w':
			fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 't':
			opts.frame_txtime = strtoul(optarg, NULL, 10);
			break;

		case 'L':
			if (sscanf(optarg, "%hhu:%hhu:%hhu",
				   &llopts.mtu,
				   &llopts.tx_dl,
				   &llopts.tx_flags) != 3) {
				printf("unknown link layer options '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 1) || (local_port == 0) ||
	    (caddr.can_addr.tp.tx_id == NO_CAN_ID) ||
	    (caddr.can_addr.tp.rx_id == NO_CAN_ID)) {
		print_usage(basename(argv[0]));
		exit(1);
	}
  
	sigemptyset(&sigset);
	signalaction.sa_handler = &childdied;
	signalaction.sa_mask = sigset;
	signalaction.sa_flags = 0;
	sigaction(SIGCHLD, &signalaction, NULL);  /* signal for dying child */

	if((sl = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
		perror("inetsocket");
		exit(1);
	}

	saddr.sin_family = AF_INET;
	saddr.sin_addr.s_addr = htonl(INADDR_ANY);
	saddr.sin_port = htons(local_port);

	while(bind(sl,(struct sockaddr*)&saddr, sizeof(saddr)) < 0) {
		struct timespec f = {
			.tv_nsec = 100 * 1000 * 1000,
		};

		printf(".");
		fflush(NULL);
		nanosleep(&f, NULL);
	}

	if (listen(sl, 3) != 0) {
		perror("listen");
		exit(1);
	}

	while (1) { 
		sa = accept(sl,(struct sockaddr *)&clientaddr, &sin_size);
		if (sa > 0 ){
			if (!fork())
				break;
			close(sa);
		}
		else {
			if (errno != EINTR) {
				/*
				 * If the cause for the error was NOT the
				 * signal from a dying child => give an error
				 */
				perror("accept");
				exit(1);
			}
		}
	}

	if ((sc = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
		perror("socket");
		exit(1);
	}

	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

	if (llopts.tx_dl) {
		if (setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
			perror("link layer sockopt");
			exit(1);
		}
	}

	caddr.can_family = AF_CAN;
	caddr.can_ifindex = if_nametoindex(argv[optind]);
	if (!caddr.can_ifindex) {
		perror("if_nametoindex");
		exit(1);
	}

	if (bind(sc, (struct sockaddr *)&caddr, caddrlen) < 0) {
		perror("bind");
		exit(1);
	}

	while (1) {

		FD_ZERO(&readfds);
		FD_SET(sc, &readfds);
		FD_SET(sa, &readfds);

		select((sc > sa)?sc+1:sa+1, &readfds, NULL, NULL, NULL);

		if (FD_ISSET(sc, &readfds)) {


			nbytes = read(sc, &msg, MAX_PDU_LENGTH + 1);

			if (nbytes < 1 || nbytes > MAX_PDU_LENGTH) {
				perror("read from isotp socket");
				exit(1);
			}

			rxmsg[0] = '<';

			for ( i = 0; i < nbytes; i++)
				sprintf(rxmsg + 1 + 2*i, "%02X", msg[i]);

			/* finalize string for sending */
			strcat(rxmsg, ">\n");

			if (verbose)
				printf("CAN>TCP %s", rxmsg);

			send(sa, rxmsg, strlen(rxmsg), 0);
		}


		if (FD_ISSET(sa, &readfds)) {

			if (read(sa, txmsg+idx, 1) < 1) {
				perror("read from tcp/ip socket");
				exit(1);
			}

			if (!idx) {
				if (txmsg[0] == '<')
					idx = 1;

				continue;
			}

			/* max len is 4095*2 + '<' + '>' = 8192. The buffer index starts with 0 */
			if (idx > MAX_PDU_LENGTH * 2 + 1) {
				idx = 0;
				continue;
			}

			if (txmsg[idx] != '>') {
				idx++;
				continue;
			}

			txmsg[idx+1] = 0;
			idx = 0;

			/* must be an even number of bytes and at least one data byte <XX> */
			if (strlen(txmsg) < 4 || strlen(txmsg) % 2)
				continue;

			if (verbose)
				printf("TCP>CAN %s\n", txmsg);

			nbytes = (strlen(txmsg)-2)/2;
			if (b64hex(txmsg+1, msg, nbytes) == 0)
				send(sc, msg, nbytes, 0);
		}
	}

	close(sc);
	close(sa);

	return 0;
}